

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_progress.c
# Opt level: O3

_Bool progress_meter(GlobalConfig *global,curltime *start,_Bool final)

{
  undefined1 auVar1 [12];
  byte bVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  bool bVar9;
  FILE *pFVar10;
  time_t tVar11;
  timediff_t tVar12;
  per_transfer *ppVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  curl_off_t cVar17;
  ulong uVar18;
  int iVar19;
  curl_off_t cVar20;
  char *pcVar21;
  curl_off_t cVar22;
  long lVar23;
  curl_off_t cVar24;
  double dVar25;
  curltime cVar26;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  curltime older_02;
  char ulpercen [4];
  char dlpercen [4];
  char time_total [10];
  char time_left [10];
  char buffer [3] [6];
  char time_spent [10];
  
  if ((global->field_0x64 & 3) != 0) {
    return false;
  }
  cVar26 = curlx_now();
  tVar11 = cVar26.tv_sec;
  iVar19 = cVar26.tv_usec;
  auVar1 = cVar26._0_12_;
  cVar26._12_4_ = 0;
  cVar26.tv_sec = auVar1._0_8_;
  cVar26.tv_usec = auVar1._8_4_;
  older.tv_usec = progress_meter_stamp_1;
  older.tv_sec = progress_meter_stamp_0;
  older._12_4_ = 0;
  tVar12 = curlx_timediff(cVar26,older);
  if (progress_meter_header == '\0') {
    progress_meter_header = '\x01';
    fputs("DL% UL%  Dled  Uled  Xfers  Live Total     Current  Left    Speed\n",(FILE *)tool_stderr)
    ;
  }
  if ((!final) && (tVar12 < 0x1f5)) {
    return false;
  }
  uVar7 = start->tv_sec;
  uVar8 = start->tv_usec;
  older_00.tv_usec = uVar8;
  older_00.tv_sec = uVar7;
  newer._12_4_ = 0;
  newer.tv_sec = auVar1._0_8_;
  newer.tv_usec = auVar1._8_4_;
  older_00._12_4_ = 0;
  tVar12 = curlx_timediff(newer,older_00);
  dlpercen[0] = '-';
  dlpercen[1] = '-';
  dlpercen[2] = '\0';
  dlpercen[3] = '\0';
  ulpercen[0] = '-';
  ulpercen[1] = '-';
  ulpercen[2] = '\0';
  ulpercen[3] = '\0';
  cVar17 = all_ultotal;
  cVar20 = all_dltotal;
  cVar22 = all_dlalready;
  cVar24 = all_ulalready;
  progress_meter_stamp_0 = tVar11;
  progress_meter_stamp_1 = iVar19;
  if (transfers == (per_transfer *)0x0) {
    bVar9 = true;
    lVar23 = 0;
    bVar2 = 1;
  }
  else {
    bVar2 = 1;
    lVar23 = 0;
    bVar9 = true;
    ppVar13 = transfers;
    do {
      if (ppVar13->dltotal == 0) {
        bVar9 = false;
      }
      else if ((ppVar13->field_0x1c0 & 1) == 0) {
        cVar20 = cVar20 + ppVar13->dltotal;
        all_dltotal = cVar20;
        ppVar13->field_0x1c0 = ppVar13->field_0x1c0 | 1;
      }
      if (ppVar13->ultotal == 0) {
        bVar2 = 0;
      }
      else if ((ppVar13->field_0x1c0 & 2) == 0) {
        cVar17 = cVar17 + ppVar13->ultotal;
        all_ultotal = cVar17;
        ppVar13->field_0x1c0 = ppVar13->field_0x1c0 | 2;
      }
      cVar22 = cVar22 + ppVar13->dlnow;
      cVar24 = cVar24 + ppVar13->ulnow;
      lVar23 = lVar23 + (ulong)(((byte)ppVar13->field_0x1d8 >> 3 & 1) != 0);
      ppVar13 = ppVar13->next;
    } while (ppVar13 != (per_transfer *)0x0);
  }
  if ((bVar9) && (cVar20 != 0)) {
    if (cVar22 < 0x147ae147ae147ae) {
      lVar14 = (cVar22 * 100) / cVar20;
    }
    else {
      lVar14 = cVar22 / (cVar20 / 100);
    }
    curl_msnprintf(dlpercen,4,"%3ld",lVar14);
    cVar17 = all_ultotal;
  }
  if ((bool)(bVar2 & cVar17 != 0)) {
    if (cVar24 < 0x147ae147ae147ae) {
      lVar14 = (cVar24 * 100) / cVar17;
    }
    else {
      lVar14 = cVar24 / (cVar17 / 100);
    }
    curl_msnprintf(ulpercen,4,"%3ld",lVar14);
  }
  uVar18 = (ulong)speedindex;
  speedindex = speedindex + 1;
  speedstore[uVar18].dl = cVar22;
  speedstore[uVar18].ul = cVar24;
  speedstore[uVar18].stamp.tv_sec = tVar11;
  speedstore[uVar18].stamp.tv_usec = iVar19;
  if (speedindex < 10) {
    if (indexwrapped != '\x01') {
      uVar3 = start->tv_sec;
      uVar4 = start->tv_usec;
      older_02.tv_usec = uVar4;
      older_02.tv_sec = uVar3;
      newer_01._12_4_ = 0;
      newer_01.tv_sec = auVar1._0_8_;
      newer_01.tv_usec = auVar1._8_4_;
      older_02._12_4_ = 0;
      lVar15 = curlx_timediff(newer_01,older_02);
      lVar14 = cVar24;
      lVar16 = cVar22;
      goto LAB_0011bd4f;
    }
  }
  else {
    indexwrapped = '\x01';
    speedindex = 0;
  }
  uVar5 = speedstore[speedindex].stamp.tv_sec;
  uVar6 = speedstore[speedindex].stamp.tv_usec;
  older_01.tv_usec = uVar6;
  older_01.tv_sec = uVar5;
  newer_00._12_4_ = 0;
  newer_00.tv_sec = auVar1._0_8_;
  newer_00.tv_usec = auVar1._8_4_;
  older_01._12_4_ = 0;
  lVar15 = curlx_timediff(newer_00,older_01);
  lVar14 = cVar24 - speedstore[speedindex].ul;
  lVar16 = cVar22 - speedstore[speedindex].dl;
LAB_0011bd4f:
  dVar25 = (double)(long)(lVar15 + (ulong)(lVar15 == 0)) / 1000.0;
  lVar16 = (long)((double)lVar16 / dVar25);
  lVar14 = (long)((double)lVar14 / dVar25);
  if (lVar14 < lVar16) {
    lVar14 = lVar16;
  }
  if ((bool)(bVar9 & lVar14 != 0)) {
    lVar16 = all_dltotal / lVar14;
    time2str(time_left,(all_dltotal - cVar22) / lVar14);
    time2str(time_total,lVar16);
  }
  else {
    builtin_strncpy(time_left,"--:--:--",9);
    builtin_strncpy(time_total,"--:--:--",9);
  }
  time2str(time_spent,tVar12 / 1000);
  pFVar10 = tool_stderr;
  max5data(cVar22,buffer[0]);
  max5data(cVar24,buffer[1]);
  cVar17 = all_xfers;
  max5data(lVar14,buffer[2]);
  pcVar21 = "";
  if (final) {
    pcVar21 = "\n";
  }
  curl_mfprintf(pFVar10,"\r%-3s %-3s %s %s %5ld %5ld  %s %s %s %s %5s",dlpercen,ulpercen,buffer,
                buffer + 1,cVar17,lVar23,time_total,time_spent,time_left,buffer + 2,pcVar21);
  return true;
}

Assistant:

bool progress_meter(struct GlobalConfig *global,
                    struct curltime *start,
                    bool final)
{
  static struct curltime stamp;
  static bool header = FALSE;
  struct curltime now;
  timediff_t diff;

  if(global->noprogress || global->silent)
    return FALSE;

  now = curlx_now();
  diff = curlx_timediff(now, stamp);

  if(!header) {
    header = TRUE;
    fputs("DL% UL%  Dled  Uled  Xfers  Live "
          "Total     Current  Left    Speed\n",
          tool_stderr);
  }
  if(final || (diff > 500)) {
    char time_left[10];
    char time_total[10];
    char time_spent[10];
    char buffer[3][6];
    curl_off_t spent = curlx_timediff(now, *start)/1000;
    char dlpercen[4]="--";
    char ulpercen[4]="--";
    struct per_transfer *per;
    curl_off_t all_dlnow = 0;
    curl_off_t all_ulnow = 0;
    bool dlknown = TRUE;
    bool ulknown = TRUE;
    curl_off_t all_running = 0; /* in progress */
    curl_off_t speed = 0;
    unsigned int i;
    stamp = now;

    /* first add the amounts of the already completed transfers */
    all_dlnow += all_dlalready;
    all_ulnow += all_ulalready;

    for(per = transfers; per; per = per->next) {
      all_dlnow += per->dlnow;
      all_ulnow += per->ulnow;
      if(!per->dltotal)
        dlknown = FALSE;
      else if(!per->dltotal_added) {
        /* only add this amount once */
        all_dltotal += per->dltotal;
        per->dltotal_added = TRUE;
      }
      if(!per->ultotal)
        ulknown = FALSE;
      else if(!per->ultotal_added) {
        /* only add this amount once */
        all_ultotal += per->ultotal;
        per->ultotal_added = TRUE;
      }
      if(per->added)
        all_running++;
    }
    if(dlknown && all_dltotal)
      msnprintf(dlpercen, sizeof(dlpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_dlnow < (CURL_OFF_T_MAX/100) ?
                (all_dlnow * 100 / all_dltotal) :
                (all_dlnow / (all_dltotal/100)));

    if(ulknown && all_ultotal)
      msnprintf(ulpercen, sizeof(ulpercen), "%3" CURL_FORMAT_CURL_OFF_T,
                all_ulnow < (CURL_OFF_T_MAX/100) ?
                (all_ulnow * 100 / all_ultotal) :
                (all_ulnow / (all_ultotal/100)));

    /* get the transfer speed, the higher of the two */

    i = speedindex;
    speedstore[i].dl = all_dlnow;
    speedstore[i].ul = all_ulnow;
    speedstore[i].stamp = now;
    if(++speedindex >= SPEEDCNT) {
      indexwrapped = TRUE;
      speedindex = 0;
    }

    {
      timediff_t deltams;
      curl_off_t dl;
      curl_off_t ul;
      curl_off_t dls;
      curl_off_t uls;
      if(indexwrapped) {
        /* 'speedindex' is the oldest stored data */
        deltams = curlx_timediff(now, speedstore[speedindex].stamp);
        dl = all_dlnow - speedstore[speedindex].dl;
        ul = all_ulnow - speedstore[speedindex].ul;
      }
      else {
        /* since the beginning */
        deltams = curlx_timediff(now, *start);
        dl = all_dlnow;
        ul = all_ulnow;
      }
      if(!deltams) /* no division by zero please */
        deltams++;
      dls = (curl_off_t)((double)dl / ((double)deltams/1000.0));
      uls = (curl_off_t)((double)ul / ((double)deltams/1000.0));
      speed = dls > uls ? dls : uls;
    }


    if(dlknown && speed) {
      curl_off_t est = all_dltotal / speed;
      curl_off_t left = (all_dltotal - all_dlnow) / speed;
      time2str(time_left, left);
      time2str(time_total, est);
    }
    else {
      time2str(time_left, 0);
      time2str(time_total, 0);
    }
    time2str(time_spent, spent);

    fprintf(tool_stderr,
            "\r"
            "%-3s " /* percent downloaded */
            "%-3s " /* percent uploaded */
            "%s " /* Dled */
            "%s " /* Uled */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Xfers */
            "%5" CURL_FORMAT_CURL_OFF_T " " /* Live */
            " %s "  /* Total time */
            "%s "  /* Current time */
            "%s "  /* Time left */
            "%s "  /* Speed */
            "%5s" /* final newline */,

            dlpercen,  /* 3 letters */
            ulpercen,  /* 3 letters */
            max5data(all_dlnow, buffer[0]),
            max5data(all_ulnow, buffer[1]),
            all_xfers,
            all_running,
            time_total,
            time_spent,
            time_left,
            max5data(speed, buffer[2]), /* speed */
            final ? "\n" :"");
    return TRUE;
  }
  return FALSE;
}